

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Vector3 ColorToHSV(Color color)

{
  Vector3 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float delta;
  float max;
  float min;
  Vector3 rgb;
  Color color_local;
  Vector3 hsv;
  
  fVar2 = (float)((uint)color & 0xff) / 255.0;
  fVar3 = (float)((uint)color >> 8 & 0xff) / 255.0;
  fVar4 = (float)((uint)color >> 0x10 & 0xff) / 255.0;
  local_4c = fVar3;
  if (fVar2 < fVar3) {
    local_4c = fVar2;
  }
  local_50 = fVar4;
  if (local_4c < fVar4) {
    local_50 = local_4c;
  }
  local_54 = fVar3;
  if (fVar3 < fVar2) {
    local_54 = fVar2;
  }
  local_58 = fVar4;
  if (fVar4 < local_54) {
    local_58 = local_54;
  }
  local_50 = local_58 - local_50;
  if (1e-05 <= local_50) {
    if (local_58 <= 0.0) {
      stack0xffffffffffffffe8 = 0x7fc00000;
    }
    else {
      if (fVar2 < local_58) {
        if (fVar3 < local_58) {
          rgb.z = (fVar2 - fVar3) / local_50 + 4.0;
        }
        else {
          rgb.z = (fVar4 - fVar2) / local_50 + 2.0;
        }
      }
      else {
        rgb.z = (fVar3 - fVar4) / local_50;
      }
      fVar2 = rgb.z * 60.0;
      if (fVar2 < 0.0) {
        fVar2 = fVar2 + 360.0;
      }
      stack0xffffffffffffffe8 = CONCAT44(local_50 / local_58,fVar2);
    }
  }
  else {
    stack0xffffffffffffffe8 = 0;
  }
  VVar1.z = local_58;
  VVar1.x = rgb.z;
  VVar1.y = (float)color_local;
  return VVar1;
}

Assistant:

Vector3 ColorToHSV(Color color)
{
    Vector3 hsv = { 0 };
    Vector3 rgb = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
    float min, max, delta;

    min = rgb.x < rgb.y? rgb.x : rgb.y;
    min = min  < rgb.z? min  : rgb.z;

    max = rgb.x > rgb.y? rgb.x : rgb.y;
    max = max  > rgb.z? max  : rgb.z;

    hsv.z = max;            // Value
    delta = max - min;

    if (delta < 0.00001f)
    {
        hsv.y = 0.0f;
        hsv.x = 0.0f;       // Undefined, maybe NAN?
        return hsv;
    }

    if (max > 0.0f)
    {
        // NOTE: If max is 0, this divide would cause a crash
        hsv.y = (delta/max);    // Saturation
    }
    else
    {
        // NOTE: If max is 0, then r = g = b = 0, s = 0, h is undefined
        hsv.y = 0.0f;
        hsv.x = NAN;        // Undefined
        return hsv;
    }

    // NOTE: Comparing float values could not work properly
    if (rgb.x >= max) hsv.x = (rgb.y - rgb.z)/delta;    // Between yellow & magenta
    else
    {
        if (rgb.y >= max) hsv.x = 2.0f + (rgb.z - rgb.x)/delta;  // Between cyan & yellow
        else hsv.x = 4.0f + (rgb.x - rgb.y)/delta;      // Between magenta & cyan
    }

    hsv.x *= 60.0f;     // Convert to degrees

    if (hsv.x < 0.0f) hsv.x += 360.0f;

    return hsv;
}